

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::NurbsCurveGeometry<2L>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,double t,Index order)

{
  Index IVar1;
  size_type sVar2;
  Index IVar3;
  Matrix<double,1,2,1,1,2> *this_00;
  Index IVar4;
  double *scalar;
  MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *this_01;
  undefined1 local_198 [16];
  type local_188;
  double *local_168;
  Index index;
  Index i;
  size_type local_148;
  Index order_1;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_138;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_110;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_e8;
  undefined1 local_b0 [8];
  NurbsCurveShapeFunction shape_function;
  Index order_local;
  double t_local;
  NurbsCurveGeometry<2L> *this_local;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *derivatives;
  
  shape_function.m_first_nonzero_pole = order;
  NurbsCurveShapeFunction::NurbsCurveShapeFunction((NurbsCurveShapeFunction *)local_b0);
  NurbsCurveShapeFunction::resize
            ((NurbsCurveShapeFunction *)local_b0,this->m_degree,shape_function.m_first_nonzero_pole)
  ;
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_weights);
  if (IVar1 < 1) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_138,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_knots,(type *)0x0);
    NurbsCurveShapeFunction::compute((NurbsCurveShapeFunction *)local_b0,&local_138,t);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_138);
  }
  else {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_e8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_knots,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_110,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_weights,(type *)0x0);
    NurbsCurveShapeFunction::compute((NurbsCurveShapeFunction *)local_b0,&local_e8,&local_110,t);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_110);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_e8);
  }
  order_1._7_1_ = 0;
  sVar2 = NurbsCurveShapeFunction::nb_shapes((NurbsCurveShapeFunction *)local_b0);
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::allocator
            ((allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&order_1 + 6));
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector(__return_storage_ptr__,sVar2,
           (allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&order_1 + 6));
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::~allocator
            ((allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&order_1 + 6));
  for (local_148 = 0; sVar2 = local_148,
      IVar3 = NurbsCurveShapeFunction::nb_shapes((NurbsCurveShapeFunction *)local_b0),
      (long)sVar2 < IVar3; local_148 = local_148 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
    this_00 = (Matrix<double,1,2,1,1,2> *)
              std::
              vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ::operator[](__return_storage_ptr__,local_148);
    Eigen::Matrix<double,1,2,1,1,2>::operator=
              (this_00,(DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                        *)&i);
    for (index = 0; IVar3 = index,
        IVar4 = NurbsCurveShapeFunction::nb_nonzero_poles((NurbsCurveShapeFunction *)local_b0),
        IVar3 < IVar4; index = index + 1) {
      IVar3 = NurbsCurveShapeFunction::first_nonzero_pole((NurbsCurveShapeFunction *)local_b0);
      local_168 = (double *)(IVar3 + index);
      pole((NurbsCurveGeometry<2L> *)local_198,(Index)this);
      scalar = NurbsCurveShapeFunction::value((NurbsCurveShapeFunction *)local_b0,local_148,index);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                ((type *)(local_198 + 0x10),(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_198
                 ,scalar);
      this_01 = (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                std::
                vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                ::operator[](__return_storage_ptr__,local_148);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator+=
                (this_01,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          *)(local_198 + 0x10));
    }
  }
  order_1._7_1_ = 1;
  NurbsCurveShapeFunction::~NurbsCurveShapeFunction((NurbsCurveShapeFunction *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order) const override
    {
        NurbsCurveShapeFunction shape_function;

        shape_function.resize(m_degree, order);

        if (m_weights.size() > 0) {
            shape_function.compute(m_knots, m_weights, t);
        } else {
            shape_function.compute(m_knots, t);
        }

        std::vector<Vector> derivatives(shape_function.nb_shapes());

        for (Index order = 0; order < shape_function.nb_shapes(); order++) {
            derivatives[order] = Vector::Zero();

            for (Index i = 0; i < shape_function.nb_nonzero_poles(); i++) {
                Index index = shape_function.first_nonzero_pole() + i;

                derivatives[order] += pole(index) * shape_function.value(order, i);
            }
        }

        return derivatives;
    }